

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_generator.cc
# Opt level: O0

void __thiscall t_generator::validate_input(t_generator *this)

{
  vector<t_enum_*,_std::allocator<t_enum_*>_> *list;
  vector<t_typedef_*,_std::allocator<t_typedef_*>_> *list_00;
  vector<t_struct_*,_std::allocator<t_struct_*>_> *list_01;
  vector<t_const_*,_std::allocator<t_const_*>_> *list_02;
  vector<t_service_*,_std::allocator<t_service_*>_> *list_03;
  t_generator *this_local;
  
  list = t_program::get_enums(this->program_);
  validate<t_enum*>(this,list);
  list_00 = t_program::get_typedefs(this->program_);
  validate<t_typedef*>(this,list_00);
  list_01 = t_program::get_objects(this->program_);
  validate<t_struct*>(this,list_01);
  list_02 = t_program::get_consts(this->program_);
  validate<t_const*>(this,list_02);
  list_03 = t_program::get_services(this->program_);
  validate<t_service*>(this,list_03);
  return;
}

Assistant:

void t_generator::validate_input() const {
  validate(program_->get_enums());
  validate(program_->get_typedefs());
  validate(program_->get_objects());
  validate(program_->get_consts());
  validate(program_->get_services());
}